

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  unsigned_long *lhs;
  AssertHelper *this_00;
  int iVar3;
  value_type vVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  AssertionResult gtest_ar;
  size_type old_bucket_count;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffbe0;
  key_equal *in_stack_fffffffffffffbe8;
  hasher *in_stack_fffffffffffffbf0;
  int index;
  undefined4 in_stack_fffffffffffffbf8;
  int in_stack_fffffffffffffbfc;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  Type TVar5;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  Message *in_stack_fffffffffffffc58;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_01;
  AssertHelper *in_stack_fffffffffffffc60;
  AssertionResult local_360;
  key_type local_350;
  pair<int,_int> local_2f0;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd20;
  AssertionResult local_228;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_218 [14];
  size_type local_130;
  AssertionResult local_128;
  key_type local_118;
  value_type local_b8;
  pair<int,_int> local_a4;
  int local_9c;
  key_type local_98;
  value_type local_38;
  pair<int,_int> local_28;
  int local_20;
  size_type local_18;
  key_type local_10;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffc08 >> 0x20);
  local_10 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffbe0,
                    (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_18 = google::
             BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1009d82);
  local_38 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
  local_20 = local_38.second;
  local_28 = local_38.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd20,
           (value_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  local_98 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffbe0,
          (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_b8 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
  local_a4 = local_b8.first;
  local_9c = local_b8.second;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd20,
           (value_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  local_118 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                          (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffbe0,
          (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_130 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1009ecb);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (char *)in_stack_fffffffffffffbf0,(unsigned_long *)in_stack_fffffffffffffbe8,
             (unsigned_long *)in_stack_fffffffffffffbe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    in_stack_fffffffffffffc60 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1009f32);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),TVar5,
               (char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
               (char *)in_stack_fffffffffffffbf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x1009f95);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x100a006);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc);
  this_01 = local_218;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_01,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffffc00,
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),in_stack_fffffffffffffbf0
             ,in_stack_fffffffffffffbe8,(allocator_type *)in_stack_fffffffffffffbe0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_218);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x100a08f);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (char *)in_stack_fffffffffffffbf0,(unsigned_long *)in_stack_fffffffffffffbe8,
             (uint *)in_stack_fffffffffffffbe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    testing::AssertionResult::failure_message((AssertionResult *)0x100a160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),TVar5,
               (char *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
               (char *)in_stack_fffffffffffffbf0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc60,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffbe0);
    testing::Message::~Message((Message *)0x100a1bd);
  }
  index = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x100a22e);
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),index);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffbe0,
                    (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_18 = google::
             BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x100a278);
  vVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
  iVar3 = vVar4.second;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd20,
           (value_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),index);
  TVar5 = kVar2.second;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffbe0,
          (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  vVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc);
  local_2f0 = vVar4.first;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)local_2f0,(value_type *)CONCAT44(in_stack_fffffffffffffd1c,vVar4.second));
  kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(vVar4.second,in_stack_fffffffffffffbf8),index);
  local_350 = kVar2;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffbe0,
          (key_type *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  lhs = (unsigned_long *)
        google::
        BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0x100a3f7);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(vVar4.second,in_stack_fffffffffffffbf8),(char *)kVar2,lhs,
             (unsigned_long *)in_stack_fffffffffffffbe0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar3,in_stack_fffffffffffffc10));
    this_00 = (AssertHelper *)
              testing::AssertionResult::failure_message((AssertionResult *)0x100a47e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar3,in_stack_fffffffffffffc10),TVar5,(char *)vVar4.first,
               vVar4.second,(char *)kVar2);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffc60,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x100a4db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x100a546);
  google::
  HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0x100a553);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}